

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::csharp::GetOutputFile
                   (string *__return_storage_ptr__,FileDescriptor *descriptor,string *file_extension
                   ,bool generate_directories,string *base_namespace,string *error)

{
  long lVar1;
  long lVar2;
  FileDescriptor *descriptor_00;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string namespace_dir;
  string ns;
  string relative_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string namespace_suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetFileNameBase_abi_cxx11_(&ns,(csharp *)descriptor,(FileDescriptor *)file_extension);
  std::operator+(&relative_filename,&ns,file_extension);
  std::__cxx11::string::~string((string *)&ns);
  if (!generate_directories) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)relative_filename._M_dataplus._M_p == &relative_filename.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(relative_filename.field_2._M_allocated_capacity._1_7_,
                    relative_filename.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = relative_filename.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = relative_filename._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(relative_filename.field_2._M_allocated_capacity._1_7_,
                    relative_filename.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = relative_filename._M_string_length;
    relative_filename._M_string_length = 0;
    relative_filename.field_2._M_local_buf[0] = '\0';
    relative_filename._M_dataplus._M_p = (pointer)&relative_filename.field_2;
    goto LAB_0024a4c8;
  }
  GetFileNamespace_abi_cxx11_(&ns,(csharp *)descriptor,descriptor_00);
  std::__cxx11::string::string((string *)&namespace_suffix,(string *)&ns);
  if (base_namespace->_M_string_length == 0) {
LAB_0024a410:
    std::__cxx11::string::string((string *)&local_118,".",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&local_90,"/",&local_119);
    StringReplace(&namespace_dir,&namespace_suffix,&local_118,&local_90,true);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_118);
    if (namespace_dir._M_string_length != 0) {
      std::__cxx11::string::append((char *)&namespace_dir);
    }
    std::operator+(__return_storage_ptr__,&namespace_dir,&relative_filename);
    std::__cxx11::string::~string((string *)&namespace_dir);
  }
  else {
    std::operator+(&namespace_dir,&ns,".");
    std::operator+(&local_118,base_namespace,".");
    lVar1 = std::__cxx11::string::find((string *)&namespace_dir,(ulong)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (lVar1 == 0) {
      std::__cxx11::string::substr((ulong)&local_118,(ulong)&ns);
      std::__cxx11::string::operator=((string *)&namespace_suffix,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      lVar2 = std::__cxx11::string::find((char *)&namespace_suffix,0x34f683);
      if (lVar2 == 0) {
        std::__cxx11::string::substr((ulong)&local_118,(ulong)&namespace_suffix);
        std::__cxx11::string::operator=((string *)&namespace_suffix,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
      }
    }
    else {
      std::operator+(&local_50,"Namespace ",&ns);
      std::operator+(&local_90,&local_50," is not a prefix namespace of base namespace ");
      std::operator+(&local_118,&local_90,base_namespace);
      std::__cxx11::string::operator=((string *)error,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_118);
    }
    std::__cxx11::string::~string((string *)&namespace_dir);
    if (lVar1 == 0) goto LAB_0024a410;
  }
  std::__cxx11::string::~string((string *)&namespace_suffix);
  std::__cxx11::string::~string((string *)&ns);
LAB_0024a4c8:
  std::__cxx11::string::~string((string *)&relative_filename);
  return __return_storage_ptr__;
}

Assistant:

std::string GetOutputFile(
    const google::protobuf::FileDescriptor* descriptor,
    const std::string file_extension,
    const bool generate_directories,
    const std::string base_namespace,
    string* error) {
  string relative_filename = GetFileNameBase(descriptor) + file_extension;
  if (!generate_directories) {
    return relative_filename;
  }
  string ns = GetFileNamespace(descriptor);
  string namespace_suffix = ns;
  if (!base_namespace.empty()) {
    // Check that the base_namespace is either equal to or a leading part of
    // the file namespace. This isn't just a simple prefix; "Foo.B" shouldn't
    // be regarded as a prefix of "Foo.Bar". The simplest option is to add "."
    // to both.
    string extended_ns = ns + ".";
    if (extended_ns.find(base_namespace + ".") != 0) {
      *error = "Namespace " + ns + " is not a prefix namespace of base namespace " + base_namespace;
      return ""; // This will be ignored, because we've set an error.
    }
    namespace_suffix = ns.substr(base_namespace.length());
    if (namespace_suffix.find(".") == 0) {
      namespace_suffix = namespace_suffix.substr(1);
    }
  }

  string namespace_dir = StringReplace(namespace_suffix, ".", "/", true);
  if (!namespace_dir.empty()) {
    namespace_dir += "/";
  }
  return namespace_dir + relative_filename;
}